

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_config_matches(ssl_config_data *data,ssl_config_data *needle)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  
  if (((data->version == needle->version) && (data->verifypeer == needle->verifypeer)) &&
     (data->verifyhost == needle->verifyhost)) {
    pcVar1 = data->CApath;
    pcVar2 = needle->CApath;
    if (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0) {
      if (pcVar1 != (char *)0x0 || pcVar2 != (char *)0x0) {
        return false;
      }
    }
    else {
      iVar3 = Curl_raw_equal(pcVar1,pcVar2);
      if (iVar3 == 0) {
        return false;
      }
    }
    pcVar1 = data->CAfile;
    pcVar2 = needle->CAfile;
    if (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0) {
      if (pcVar1 != (char *)0x0 || pcVar2 != (char *)0x0) {
        return false;
      }
    }
    else {
      iVar3 = Curl_raw_equal(pcVar1,pcVar2);
      if (iVar3 == 0) {
        return false;
      }
    }
    pcVar1 = data->random_file;
    pcVar2 = needle->random_file;
    if (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0) {
      if (pcVar1 != (char *)0x0 || pcVar2 != (char *)0x0) {
        return false;
      }
    }
    else {
      iVar3 = Curl_raw_equal(pcVar1,pcVar2);
      if (iVar3 == 0) {
        return false;
      }
    }
    pcVar1 = data->egdsocket;
    pcVar2 = needle->egdsocket;
    if (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0) {
      if (pcVar1 != (char *)0x0 || pcVar2 != (char *)0x0) {
        return false;
      }
    }
    else {
      iVar3 = Curl_raw_equal(pcVar1,pcVar2);
      if (iVar3 == 0) {
        return false;
      }
    }
    pcVar1 = data->cipher_list;
    pcVar2 = needle->cipher_list;
    if (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0) {
      if (pcVar1 == (char *)0x0 && pcVar2 == (char *)0x0) {
        return true;
      }
    }
    else {
      iVar3 = Curl_raw_equal(pcVar1,pcVar2);
      if (iVar3 != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_config_data* data,
                        struct ssl_config_data* needle)
{
  if((data->version == needle->version) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     safe_strequal(data->CApath, needle->CApath) &&
     safe_strequal(data->CAfile, needle->CAfile) &&
     safe_strequal(data->random_file, needle->random_file) &&
     safe_strequal(data->egdsocket, needle->egdsocket) &&
     safe_strequal(data->cipher_list, needle->cipher_list))
    return TRUE;

  return FALSE;
}